

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_lib.cc
# Opt level: O2

int X509V3_EXT_add(X509V3_EXT_METHOD *ext)

{
  size_t sVar1;
  
  if (ext->it == (ASN1_ITEM_EXP *)0x0) {
    __assert_fail("ext->it != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_lib.cc"
                  ,0x29,"int X509V3_EXT_add(X509V3_EXT_METHOD *)");
  }
  if (((ext_list != (stack_st_X509V3_EXT_METHOD *)0x0) ||
      (ext_list = (stack_st_X509V3_EXT_METHOD *)OPENSSL_sk_new(ext_stack_cmp),
      (OPENSSL_STACK *)ext_list != (OPENSSL_STACK *)0x0)) &&
     (sVar1 = OPENSSL_sk_push((OPENSSL_STACK *)ext_list,ext), sVar1 != 0)) {
    sk_X509V3_EXT_METHOD_sort(ext_list);
    return 1;
  }
  return 0;
}

Assistant:

int X509V3_EXT_add(X509V3_EXT_METHOD *ext) {
  // We only support |ASN1_ITEM|-based extensions.
  assert(ext->it != NULL);

  // TODO(davidben): This should be locked. Also check for duplicates.
  if (!ext_list && !(ext_list = sk_X509V3_EXT_METHOD_new(ext_stack_cmp))) {
    return 0;
  }
  if (!sk_X509V3_EXT_METHOD_push(ext_list, ext)) {
    return 0;
  }
  sk_X509V3_EXT_METHOD_sort(ext_list);
  return 1;
}